

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MLVariant.cpp
# Opt level: O2

bool Kernel::MLVariant_AUX::createLiteralBindings
               (Literal *baseLit,LiteralList *alts,Clause *instCl,uint **boundVarData,
               uint ***altBindingPtrs,uint **altBindingData)

{
  uint *puVar1;
  Term *l2;
  bool bVar2;
  uint uVar3;
  int iVar4;
  _func_int **pp_Var5;
  ArrayStoringBinder *binder_00;
  uint val;
  ArrayStoringBinder binder;
  VariableIterator bvit;
  undefined1 local_a0 [16];
  Clause *local_90;
  uint ***local_88;
  anon_union_8_2_f154dc0f_for_Term_10 local_80;
  VariableIterator local_78;
  
  local_90 = instCl;
  local_88 = altBindingPtrs;
  local_80 = (anon_union_8_2_f154dc0f_for_Term_10)boundVarData;
  if (createLiteralBindings(Kernel::Literal*,Lib::List<Kernel::Literal*>*,Kernel::Clause*,unsigned_int*&,unsigned_int*&*,unsigned_int*&)
      ::variablePositions == '\0') {
    iVar4 = __cxa_guard_acquire(&createLiteralBindings(Kernel::Literal*,Lib::List<Kernel::Literal*>*,Kernel::Clause*,unsigned_int*&,unsigned_int*&*,unsigned_int*&)
                                 ::variablePositions);
    if (iVar4 != 0) {
      createLiteralBindings::variablePositions._timestamp = 1;
      createLiteralBindings::variablePositions._size = 0;
      createLiteralBindings::variablePositions._deleted = 0;
      createLiteralBindings::variablePositions._capacityIndex = 0;
      createLiteralBindings::variablePositions._capacity = 0;
      createLiteralBindings::variablePositions._20_8_ = 0;
      createLiteralBindings::variablePositions._28_8_ = 0;
      createLiteralBindings::variablePositions._afterLast._4_4_ = 0;
      __cxa_atexit(Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::
                   ~DHMap,&createLiteralBindings::variablePositions,&__dso_handle);
      __cxa_guard_release(&createLiteralBindings(Kernel::Literal*,Lib::List<Kernel::Literal*>*,Kernel::Clause*,unsigned_int*&,unsigned_int*&*,unsigned_int*&)
                           ::variablePositions);
    }
  }
  if (createLiteralBindings(Kernel::Literal*,Lib::List<Kernel::Literal*>*,Kernel::Clause*,unsigned_int*&,unsigned_int*&*,unsigned_int*&)
      ::varNums == '\0') {
    iVar4 = __cxa_guard_acquire(&createLiteralBindings(Kernel::Literal*,Lib::List<Kernel::Literal*>*,Kernel::Clause*,unsigned_int*&,unsigned_int*&*,unsigned_int*&)
                                 ::varNums);
    if (iVar4 != 0) {
      createLiteralBindings::varNums._size = 0;
      createLiteralBindings::varNums._capacity = 0;
      createLiteralBindings::varNums._data = (uint *)0x0;
      createLiteralBindings::varNums._data1 = (uint *)0x0;
      __cxa_atexit(Lib::BinaryHeap<unsigned_int,_Lib::Int>::~BinaryHeap,
                   &createLiteralBindings::varNums,&__dso_handle);
      __cxa_guard_release(&createLiteralBindings(Kernel::Literal*,Lib::List<Kernel::Literal*>*,Kernel::Clause*,unsigned_int*&,unsigned_int*&*,unsigned_int*&)
                           ::varNums);
    }
  }
  Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::reset
            (&createLiteralBindings::variablePositions);
  createLiteralBindings::varNums._0_8_ = createLiteralBindings::varNums._0_8_ & 0xffffffff00000000;
  VariableIterator::VariableIterator(&local_78,&baseLit->super_Term);
  while( true ) {
    bVar2 = VariableIterator::hasNext(&local_78);
    if (!bVar2) break;
    local_78._used = true;
    Lib::BinaryHeap<unsigned_int,_Lib::Int>::insert
              (&createLiteralBindings::varNums,(uint)(local_78._stack._cursor[-1]->_content >> 2));
  }
  val = 0;
  while (createLiteralBindings::varNums._size != 0) {
    uVar3 = Lib::BinaryHeap<unsigned_int,_Lib::Int>::pop(&createLiteralBindings::varNums);
    while ((createLiteralBindings::varNums._size != 0 &&
           (*createLiteralBindings::varNums._data == uVar3))) {
      Lib::BinaryHeap<unsigned_int,_Lib::Int>::pop(&createLiteralBindings::varNums);
    }
    bVar2 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::insert
                      (&createLiteralBindings::variablePositions,uVar3,val);
    if (bVar2) {
      puVar1 = *(uint **)local_80;
      boundVarData = (uint **)(puVar1 + 1);
      *(uint ***)local_80 = boundVarData;
      *puVar1 = uVar3;
      val = val + 1;
    }
  }
LAB_00447e6d:
  if (alts == (LiteralList *)0x0) {
    VariableIterator::~VariableIterator(&local_78);
    return true;
  }
  l2 = &alts->_head->super_Term;
  alts = alts->_tail;
  if (l2->_functor == 0) goto LAB_00447ed5;
  pp_Var5 = (_func_int **)*altBindingData;
  if (val != 0) {
    local_a0._8_8_ = &createLiteralBindings::variablePositions;
    local_a0._0_8_ = pp_Var5;
    MatchingUtils::matchArgs<Kernel::MLVariant_AUX::ArrayStoringBinder>
              ((MatchingUtils *)baseLit,l2,(Term *)local_a0,(ArrayStoringBinder *)boundVarData);
    pp_Var5 = (_func_int **)*altBindingData;
  }
  **local_88 = (uint *)pp_Var5;
  *local_88 = *local_88 + 1;
  *altBindingData = *altBindingData + val;
  uVar3 = Clause::getLiteralPosition(local_90,(Literal *)l2);
  goto LAB_00447fe2;
LAB_00447ed5:
  bVar2 = MatchingUtils::haveVariantArgs(&baseLit->super_Term,l2);
  if (bVar2) {
    local_a0._0_8_ = *altBindingData;
    local_a0._8_8_ = &createLiteralBindings::variablePositions;
    MatchingUtils::matchArgs<Kernel::MLVariant_AUX::ArrayStoringBinder>
              ((MatchingUtils *)baseLit,l2,(Term *)local_a0,(ArrayStoringBinder *)boundVarData);
    **local_88 = *altBindingData;
    *local_88 = *local_88 + 1;
    *altBindingData = *altBindingData + val;
    uVar3 = Clause::getLiteralPosition(local_90,(Literal *)l2);
    boundVarData = (uint **)*altBindingData;
    *altBindingData = (uint *)((long)&((ArrayStoringBinder *)boundVarData)->_arr + 4);
    *(uint *)&((ArrayStoringBinder *)boundVarData)->_arr = uVar3;
  }
  bVar2 = MatchingUtils::haveReversedVariantArgs(&baseLit->super_Term,l2);
  if (bVar2) {
    local_a0._0_8_ = *altBindingData;
    local_a0._8_8_ = &createLiteralBindings::variablePositions;
    MatchingUtils::matchTerms<Kernel::MLVariant_AUX::ArrayStoringBinder>
              ((MatchingUtils *)
               (baseLit->super_Term)._args[*(uint *)&(baseLit->super_Term).field_0xc & 0xfffffff].
               _content,(TermList)
                        l2->_args[(ulong)(*(uint *)&l2->field_0xc & 0xfffffff) - 1]._content,
               (TermList)local_a0,(ArrayStoringBinder *)0xfffffff);
    binder_00 = (ArrayStoringBinder *)0xfffffff;
    MatchingUtils::matchTerms<Kernel::MLVariant_AUX::ArrayStoringBinder>
              ((MatchingUtils *)
               (baseLit->super_Term)._args
               [(ulong)(*(uint *)&(baseLit->super_Term).field_0xc & 0xfffffff) - 1]._content,
               (TermList)l2->_args[*(uint *)&l2->field_0xc & 0xfffffff]._content,(TermList)local_a0,
               (ArrayStoringBinder *)0xfffffff);
    if (*(int *)&(baseLit->super_Term).field_0xc < 0) {
      MatchingUtils::matchTerms<Kernel::MLVariant_AUX::ArrayStoringBinder>
                ((MatchingUtils *)(baseLit->super_Term).field_9,
                 (TermList)(l2->field_9)._sort._content,(TermList)local_a0,binder_00);
    }
    **local_88 = *altBindingData;
    *local_88 = *local_88 + 1;
    *altBindingData = *altBindingData + val;
    uVar3 = Clause::getLiteralPosition(local_90,(Literal *)l2);
LAB_00447fe2:
    boundVarData = (uint **)*altBindingData;
    *altBindingData = (uint *)((long)&((ArrayStoringBinder *)boundVarData)->_arr + 4);
    *(uint *)&((ArrayStoringBinder *)boundVarData)->_arr = uVar3;
  }
  goto LAB_00447e6d;
}

Assistant:

bool createLiteralBindings(Literal* baseLit, LiteralList* alts, Clause* instCl,
    unsigned*& boundVarData, unsigned**& altBindingPtrs, unsigned*& altBindingData)
{
  static UUMap variablePositions;
  static BinaryHeap<unsigned,Int> varNums;
  variablePositions.reset();
  varNums.reset();

  VariableIterator bvit(baseLit);
  while(bvit.hasNext()) {
    unsigned var=bvit.next().var();
    varNums.insert(var);
  }

  unsigned nextPos=0;
  while(!varNums.isEmpty()) {
    unsigned var=varNums.pop();
    while(!varNums.isEmpty() && varNums.top()==var) {
      varNums.pop();
    }
    if(variablePositions.insert(var,nextPos)) {
      *(boundVarData++)=var;
      nextPos++;
    }
  }
  unsigned numVars=nextPos;

  LiteralList::Iterator ait(alts);
  while(ait.hasNext()) {
    //handle multiple matches in equality!
    Literal* alit=ait.next();
    if(alit->isEquality()) {
      //we must try both possibilities
      if(MatchingUtils::haveVariantArgs(baseLit,alit)) {
        ArrayStoringBinder binder(altBindingData, variablePositions);
        MatchingUtils::matchArgs(baseLit,alit,binder);
        *altBindingPtrs=altBindingData;
        altBindingPtrs++;
        altBindingData+=numVars;

        //add pointer to the literal at
        //the end of the binding sequence
        *(altBindingData++)=instCl->getLiteralPosition(alit);
      }
      if(MatchingUtils::haveReversedVariantArgs(baseLit, alit)) {
        ArrayStoringBinder binder(altBindingData, variablePositions);
        MatchingUtils::matchTerms(*baseLit->nthArgument(0),*alit->nthArgument(1),binder);
        MatchingUtils::matchTerms(*baseLit->nthArgument(1),*alit->nthArgument(0),binder);
        if(baseLit->isTwoVarEquality()){
          ASS(alit->isTwoVarEquality());
          MatchingUtils::matchTerms(baseLit->twoVarEqSort(),alit->twoVarEqSort(),binder);
        } //matchArgs automatically matches the sorts of literals if one is a twoVarEq literal
          //This is the reason for the difference between the two cases.
        *altBindingPtrs=altBindingData;
        altBindingPtrs++;
        altBindingData+=numVars;

        //add pointer to the literal at
        //the end of the binding sequence
        *(altBindingData++)=instCl->getLiteralPosition(alit);
      }

    } else {
      if(numVars) {
        ArrayStoringBinder binder(altBindingData, variablePositions);
        ALWAYS(MatchingUtils::matchArgs(baseLit,alit,binder));
      }

      *altBindingPtrs=altBindingData;
      altBindingPtrs++;
      altBindingData+=numVars;

      //add index of the literal in instance clause at
      //the end of the binding sequence
      *(altBindingData++) = (size_t)instCl->getLiteralPosition(alit);
    }
  }
  return true;
}